

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int localvar_explist(LexState *ls,expdesc *v,ravi_type_map *vars,TString **usertypes,int nvars)

{
  int iVar1;
  int local_30;
  int n;
  int nvars_local;
  TString **usertypes_local;
  ravi_type_map *vars_local;
  expdesc *v_local;
  LexState *ls_local;
  
  local_30 = 1;
  expr(ls,v);
  ravi_typecheck(ls,v,vars,usertypes,nvars,0);
  while( true ) {
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) break;
    luaK_exp2nextreg(ls->fs,v);
    expr(ls,v);
    ravi_typecheck(ls,v,vars,usertypes,nvars,local_30);
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

static int localvar_explist(LexState *ls, expdesc *v, ravi_type_map *vars, TString** usertypes, int nvars) {
  /* explist -> expr { ',' expr } */
  int n = 1;  /* at least one expression */
  expr(ls, v);
  ravi_typecheck(ls, v, vars, usertypes, nvars, 0);
  while (testnext(ls, ',')) {
    luaK_exp2nextreg(ls->fs, v);
    expr(ls, v);
    ravi_typecheck(ls, v, vars, usertypes, nvars, n);
    n++;
  }
  return n;
}